

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O3

int __thiscall
event_track::ingest_event_stream::print_samples_from_file
          (ingest_event_stream *this,istream *infile,bool init_only)

{
  string *psVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  uint uVar6;
  uint64_t uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  pointer puVar10;
  int iVar11;
  uint32_t uVar12;
  ssize_t sVar13;
  ostream *poVar14;
  ulong uVar15;
  size_t in_RCX;
  ulong uVar16;
  undefined7 in_register_00000011;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  ulong uVar17;
  pointer pbVar18;
  uint uVar19;
  ingest_event_stream *piVar20;
  bool bVar21;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sample_data;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> ingest_boxes;
  exception e;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_670;
  uint64_t local_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_648;
  ulong local_640;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_638;
  ingest_event_stream *local_630;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> local_628;
  DASHEventMessageBoxv1 local_608;
  undefined ***local_530;
  undefined1 *local_528;
  long local_520;
  ulong local_518;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_510;
  uint8_t *local_508;
  string *local_500;
  uint32_t *local_4f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4f0;
  uint8_t *local_4e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_4e0;
  uint8_t *local_4d8;
  string *local_4d0;
  uint32_t *local_4c8;
  string *local_4c0;
  uint32_t *local_4b8;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  pointer local_4a0;
  uint8_t *local_498;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_490;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_488;
  uint8_t *local_480;
  string *local_478;
  uint32_t *local_470;
  string *local_468;
  uint32_t *local_460;
  long *local_458 [2];
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  undefined1 local_418 [264];
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  uint8_t local_2f0 [8];
  uint8_t auStack_2e8 [8];
  undefined1 local_2e0 [24];
  undefined2 uStack_2c8;
  undefined **local_2c0;
  undefined8 local_2b8;
  uint64_t uStack_2b0;
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  uint8_t local_288 [8];
  uint8_t auStack_280 [8];
  undefined1 local_278 [24];
  undefined2 uStack_260;
  undefined8 local_258 [3];
  mfhd local_240;
  tfhd local_1d0;
  tfdt local_140;
  trun local_c8;
  
  __buf = (void *)CONCAT71(in_register_00000011,init_only);
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) == 0) {
    local_628.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_628.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_628.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_630 = this;
    do {
      if (*(int *)(infile + *(long *)(*(long *)infile + -0x18) + 0x20) != 0) break;
      local_418._0_8_ = &PTR_size_00121ad0;
      local_418._8_4_ = 0;
      local_418._16_8_ = 0;
      local_418._24_8_ = local_418 + 0x28;
      local_418._32_8_ = 0;
      local_418[0x28] = '\0';
      local_418._88_2_ = 0;
      local_418._90_6_ = 0;
      local_418[0x60] = false;
      local_418[0x61] = false;
      local_418._72_8_ = (pointer)0x0;
      local_418._80_2_ = 0;
      local_418._82_6_ = 0;
      sVar13 = fmp4_stream::box::read((box *)local_418,(int)infile,__buf,in_RCX);
      if ((char)sVar13 == '\0') {
        bVar21 = false;
        __buf = extraout_RDX;
      }
      else {
        std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::push_back
                  (&local_628,(value_type *)local_418);
        iVar11 = std::__cxx11::string::compare(local_418 + 0x18);
        bVar21 = iVar11 != 0;
        __buf = extraout_RDX_00;
      }
      local_418._0_8_ = &PTR_size_00121ad0;
      if ((pointer)local_418._72_8_ != (pointer)0x0) {
        operator_delete((void *)local_418._72_8_,
                        CONCAT62(local_418._90_6_,local_418._88_2_) - local_418._72_8_);
        __buf = extraout_RDX_01;
      }
      if ((undefined1 *)local_418._24_8_ != local_418 + 0x28) {
        operator_delete((void *)local_418._24_8_,CONCAT71(local_418._41_7_,local_418[0x28]) + 1);
        __buf = extraout_RDX_02;
      }
    } while (bVar21);
    if (local_628.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_628.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_460 = &(local_630->super_ingest_stream).init_fragment_.ftyp_box_.size_;
      local_468 = (string *)&(local_630->super_ingest_stream).init_fragment_.ftyp_box_.box_type_;
      local_480 = (local_630->super_ingest_stream).init_fragment_.ftyp_box_.extended_type_;
      local_490 = &(local_630->super_ingest_stream).init_fragment_.moov_box_.box_data_;
      local_4a0 = local_418 + 0x90;
      local_4a8 = (undefined8 *)(local_418 + 0xb0);
      local_528 = local_418 + 0xf0;
      local_530 = &local_2c0;
      local_4b0 = local_258;
      local_650 = &local_608.scheme_id_uri_.field_2;
      local_648 = &local_608.value_.field_2;
      local_4b8 = &(local_630->super_ingest_stream).mfra_box_.size_;
      local_4c8 = &(local_630->super_ingest_stream).sidx_box_.size_;
      local_4f8 = &(local_630->super_ingest_stream).meta_box_.size_;
      local_488 = &(local_630->super_ingest_stream).init_fragment_.ftyp_box_.box_data_;
      local_470 = &(local_630->super_ingest_stream).init_fragment_.moov_box_.size_;
      local_478 = (string *)&(local_630->super_ingest_stream).init_fragment_.moov_box_.box_type_;
      local_498 = (local_630->super_ingest_stream).init_fragment_.moov_box_.extended_type_;
      local_638 = &local_608.message_data_;
      local_4c0 = (string *)&(local_630->super_ingest_stream).mfra_box_.box_type_;
      local_4d8 = (local_630->super_ingest_stream).mfra_box_.extended_type_;
      local_4e0 = &(local_630->super_ingest_stream).mfra_box_.box_data_;
      local_4d0 = (string *)&(local_630->super_ingest_stream).sidx_box_.box_type_;
      local_4e8 = (local_630->super_ingest_stream).sidx_box_.extended_type_;
      local_4f0 = &(local_630->super_ingest_stream).sidx_box_.box_data_;
      local_500 = (string *)&(local_630->super_ingest_stream).meta_box_.box_type_;
      local_508 = (local_630->super_ingest_stream).meta_box_.extended_type_;
      local_510 = &(local_630->super_ingest_stream).meta_box_.box_data_;
      pbVar18 = local_628.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
                _M_impl.super__Vector_impl_data._M_start;
      piVar20 = local_630;
      do {
        psVar1 = &pbVar18->box_type_;
        iVar11 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar11 == 0) {
          uVar9 = *(undefined4 *)&pbVar18->field_0xc;
          uVar7 = pbVar18->large_size_;
          local_460[0] = pbVar18->size_;
          local_460[1] = uVar9;
          *(uint64_t *)(local_460 + 2) = uVar7;
          std::__cxx11::string::_M_assign(local_468);
          uVar8 = *(undefined8 *)(pbVar18->extended_type_ + 8);
          *(undefined8 *)local_480 = *(undefined8 *)pbVar18->extended_type_;
          *(undefined8 *)(local_480 + 8) = uVar8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_488,&pbVar18->box_data_);
          bVar21 = pbVar18->has_uuid_;
          (piVar20->super_ingest_stream).init_fragment_.ftyp_box_.is_large_ = pbVar18->is_large_;
          (piVar20->super_ingest_stream).init_fragment_.ftyp_box_.has_uuid_ = bVar21;
        }
        iVar11 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar11 == 0) {
          uVar9 = *(undefined4 *)&pbVar18->field_0xc;
          uVar7 = pbVar18->large_size_;
          local_470[0] = pbVar18->size_;
          local_470[1] = uVar9;
          *(uint64_t *)(local_470 + 2) = uVar7;
          std::__cxx11::string::_M_assign(local_478);
          uVar8 = *(undefined8 *)(pbVar18->extended_type_ + 8);
          *(undefined8 *)local_498 = *(undefined8 *)pbVar18->extended_type_;
          *(undefined8 *)(local_498 + 8) = uVar8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_490,&pbVar18->box_data_);
          bVar21 = pbVar18->has_uuid_;
          (piVar20->super_ingest_stream).init_fragment_.moov_box_.is_large_ = pbVar18->is_large_;
          (piVar20->super_ingest_stream).init_fragment_.moov_box_.has_uuid_ = bVar21;
          if (init_only) {
            std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_628);
            return 0;
          }
        }
        iVar11 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar11 == 0) {
          local_418._0_8_ = &PTR_size_00121ad0;
          local_418._8_4_ = 0;
          local_418._16_8_ = 0;
          local_418._24_8_ = local_418 + 0x28;
          local_418._32_8_ = 0;
          local_418[0x28] = '\0';
          local_418._88_2_ = 0;
          local_418._90_6_ = 0;
          local_418[0x60] = false;
          local_418[0x61] = false;
          local_418._72_8_ = (pointer)0x0;
          local_418._80_2_ = 0;
          local_418._82_6_ = 0;
          local_418._104_8_ = &PTR_size_00121ad0;
          local_418._112_4_ = 0;
          local_418._120_8_ = 0;
          local_418._128_8_ = local_4a0;
          local_418._136_8_ = 0;
          local_418[0x90] = '\0';
          *(undefined8 *)((long)local_4a8 + 10) = 0;
          *(undefined8 *)((long)local_4a8 + 0x12) = 0;
          *local_4a8 = 0;
          local_4a8[1] = 0;
          local_418[0xe0] = 0;
          local_418._225_8_ = 0;
          local_418._208_8_ = (pointer)0x0;
          local_418[0xd8] = 0;
          local_418._217_7_ = 0;
          local_418._240_8_ = &PTR_size_00121ad0;
          local_418._248_8_ = (ulong)(uint)local_418._252_4_ << 0x20;
          local_418._256_8_ = 0;
          local_310._M_p = (pointer)&local_300;
          local_308 = 0;
          local_300._M_local_buf[0] = '\0';
          local_2e0._16_2_ = 0;
          stack0xfffffffffffffd32 = 0;
          local_2e0._0_8_ = (pointer)0x0;
          local_2e0._8_2_ = 0;
          local_2e0._10_6_ = 0;
          local_2c0 = &PTR_size_00121ad0;
          local_2b8 = (ulong)local_2b8._4_4_ << 0x20;
          uStack_2b0 = 0;
          local_2a8._M_p = (pointer)&local_298;
          local_2a0 = 0;
          local_298._M_local_buf[0] = '\0';
          local_278._16_2_ = 0;
          stack0xfffffffffffffd9a = 0;
          local_278._0_8_ = (pointer)0x0;
          local_278._8_2_ = 0;
          local_278._10_6_ = 0;
          *(undefined4 *)(local_4b0 + 2) = 0;
          *local_4b0 = 0;
          local_4b0[1] = 0;
          fmp4_stream::mfhd::mfhd(&local_240);
          fmp4_stream::tfhd::tfhd(&local_1d0);
          fmp4_stream::tfdt::tfdt(&local_140);
          fmp4_stream::trun::trun(&local_c8);
          local_418._248_4_ = pbVar18->size_;
          local_418._252_4_ = *(undefined4 *)&pbVar18->field_0xc;
          local_418._256_8_ = pbVar18->large_size_;
          std::__cxx11::string::_M_assign((string *)&local_310);
          local_2f0 = *(uint8_t (*) [8])pbVar18->extended_type_;
          auStack_2e8 = *(uint8_t (*) [8])(pbVar18->extended_type_ + 8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2e0,
                     &pbVar18->box_data_);
          uVar8 = stack0xfffffffffffffd32;
          uVar2 = pbVar18->is_large_;
          uVar4 = pbVar18->has_uuid_;
          uStack_2c8._1_1_ = (bool)uVar4;
          uStack_2c8._0_1_ = (bool)uVar2;
          local_2e0._18_6_ = (undefined6)uVar8;
          fmp4_stream::media_fragment::parse_moof((media_fragment *)local_418);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"==  found movie fragment with base media decode time: ",
                     0x36);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          std::ostream::put((char)poVar14);
          std::ostream::flush();
          if ((local_1d0.default_base_is_moof_ == true) &&
             (local_c8.data_offset_ - 8U == local_418._248_4_)) {
            iVar11 = std::__cxx11::string::compare((char *)&pbVar18[1].box_type_);
            if (iVar11 == 0) {
              local_2b8 = *(long *)&pbVar18[1].size_;
              uStack_2b0 = pbVar18[1].large_size_;
              std::__cxx11::string::_M_assign((string *)&local_2a8);
              local_288 = *(uint8_t (*) [8])pbVar18[1].extended_type_;
              auStack_280 = *(uint8_t (*) [8])(pbVar18[1].extended_type_ + 8);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278,
                         &pbVar18[1].box_data_);
              uVar8 = stack0xfffffffffffffd9a;
              uVar3 = pbVar18[1].is_large_;
              uVar5 = pbVar18[1].has_uuid_;
              uStack_260._1_1_ = (bool)uVar5;
              uStack_260._0_1_ = (bool)uVar3;
              local_278._18_6_ = (undefined6)uVar8;
              if (((local_c8.sample_duration_present_ == true) &&
                  (local_c8.sample_size_present_ == true)) &&
                 (local_c8.m_sentry.
                  super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_c8.m_sentry.
                  super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                  ._M_impl.super__Vector_impl_data._M_start)) {
                uVar17 = 0;
                local_658 = local_140.base_media_decode_time_;
                local_640 = 0;
                do {
                  uVar6 = local_c8.m_sentry.
                          super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar17].sample_size_;
                  uVar15 = (ulong)uVar6;
                  local_518 = uVar17;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            (&local_670,uVar15,(allocator_type *)&local_608);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"== found sample, presentation time = ",0x25);
                  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14," duration = ",0xc);
                  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14," sample size = ",0xf);
                  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14," == ",4);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                  std::ostream::put((char)poVar14);
                  std::ostream::flush();
                  puVar10 = local_670.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  local_520 = uVar17 * 0x20;
                  if (uVar15 == 0) {
LAB_00114c9a:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"empty sample (embe/emeb): ",0x1a);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
                    std::ostream::put('\x10');
                    std::ostream::flush();
                  }
                  else {
                    uVar16 = 0;
                    do {
                      local_670.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar16] =
                           *(pointer)(local_278._0_8_ +
                                     (ulong)(uint)((int)local_640 + 8 + (int)uVar16));
                      uVar16 = uVar16 + 1;
                    } while (uVar15 != uVar16);
                    if (uVar6 < 9) goto LAB_00114c9a;
                    local_438[0] = local_428;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"emib","");
                    if (((puVar10[4] != (uchar)*local_438[0]) ||
                        (puVar10[5] != *(uchar *)((long)local_438[0] + 1))) ||
                       ((puVar10[6] != *(uchar *)((long)local_438[0] + 2) ||
                        (bVar21 = true, puVar10[7] != *(uchar *)((long)local_438[0] + 3))))) {
                      bVar21 = false;
                    }
                    if (local_438[0] != local_428) {
                      operator_delete(local_438[0],local_428[0] + 1);
                    }
                    puVar10 = local_670.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    if (bVar21) {
                      uVar17 = (long)local_670.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_670.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      if (uVar17 != 0) {
                        uVar15 = 0;
                        uVar19 = 0;
                        do {
                          local_608.super_full_box.super_box.size_ = 0;
                          local_608.super_full_box.super_box.large_size_ = 0;
                          local_608.super_full_box.super_box.box_type_._M_dataplus._M_p =
                               (pointer)&local_608.super_full_box.super_box.box_type_.field_2;
                          local_608.super_full_box.super_box.box_type_._M_string_length = 0;
                          local_608.super_full_box.super_box.box_type_.field_2._M_local_buf[0] =
                               '\0';
                          local_608.super_full_box.super_box._100_4_ = 0;
                          local_608.super_full_box.magic_conf_ = 0;
                          local_608.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._0_3_ = 0;
                          local_608.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._3_5_ = 0;
                          local_608.super_full_box.super_box.is_large_ = false;
                          local_608.super_full_box.super_box.has_uuid_ = false;
                          local_608.super_full_box.super_box._98_1_ = 0;
                          local_608.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_608.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish._0_3_ = 0;
                          local_608.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish._3_5_ = 0;
                          local_608.super_full_box.super_box._vptr_box =
                               (_func_int **)&PTR_size_00121d38;
                          local_608.id_ = 0;
                          local_608._108_8_ = 0;
                          local_608._116_8_ = 0;
                          local_608.scheme_id_uri_._M_dataplus._M_p = (pointer)local_650;
                          local_608.scheme_id_uri_._M_string_length = 0;
                          local_608.scheme_id_uri_.field_2._M_local_buf[0] = '\0';
                          local_608.value_._M_dataplus._M_p = (pointer)local_648;
                          local_608.value_._M_string_length = 0;
                          local_608.value_.field_2._M_local_buf[0] = '\0';
                          (local_638->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          (local_638->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start = (pointer)0x0;
                          (local_638->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish = (pointer)0x0;
                          uVar12 = EventMessageInstanceBox::parse
                                             ((EventMessageInstanceBox *)&local_608,
                                              (char *)(local_670.
                                                                                                              
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar15
                                                  ),(uint)uVar17,local_658);
                          EventMessageInstanceBox::print((EventMessageInstanceBox *)&local_608);
                          local_608.super_full_box.super_box._vptr_box =
                               (_func_int **)&PTR_size_00121d38;
                          if (local_608.message_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_608.message_data_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_608.message_data_.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_608.message_data_.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_608.value_._M_dataplus._M_p != local_648) {
                            operator_delete(local_608.value_._M_dataplus._M_p,
                                            CONCAT71(local_608.value_.field_2._M_allocated_capacity.
                                                     _1_7_,local_608.value_.field_2._M_local_buf[0])
                                            + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_608.scheme_id_uri_._M_dataplus._M_p != local_650) {
                            operator_delete(local_608.scheme_id_uri_._M_dataplus._M_p,
                                            CONCAT71(local_608.scheme_id_uri_.field_2.
                                                     _M_allocated_capacity._1_7_,
                                                     local_608.scheme_id_uri_.field_2._M_local_buf
                                                     [0]) + 1);
                          }
                          local_608.super_full_box.super_box._vptr_box =
                               (_func_int **)&PTR_size_00121ad0;
                          if (local_608.super_full_box.super_box.box_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_608.super_full_box.super_box.box_data_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            CONCAT53(local_608.super_full_box.super_box.box_data_.
                                                                                                          
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._3_5_,local_608.super_full_box.super_box.
                                                         box_data_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_3_) -
                                            (long)local_608.super_full_box.super_box.box_data_.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_608.super_full_box.super_box.box_type_._M_dataplus._M_p !=
                              &local_608.super_full_box.super_box.box_type_.field_2) {
                            operator_delete(local_608.super_full_box.super_box.box_type_._M_dataplus
                                            ._M_p,CONCAT71(local_608.super_full_box.super_box.
                                                           box_type_.field_2._M_allocated_capacity.
                                                           _1_7_,local_608.super_full_box.super_box.
                                                                 box_type_.field_2._M_local_buf[0])
                                                  + 1);
                          }
                          uVar19 = uVar19 + uVar12;
                          uVar15 = (ulong)uVar19;
                          uVar17 = (long)local_670.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_670.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                        } while (uVar15 < uVar17);
                      }
                    }
                    else {
                      local_458[0] = local_448;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"emsg","")
                      ;
                      if (((puVar10[4] != (uchar)*local_458[0]) ||
                          (puVar10[5] != *(uchar *)((long)local_458[0] + 1))) ||
                         ((puVar10[6] != *(uchar *)((long)local_458[0] + 2) ||
                          (bVar21 = true, puVar10[7] != *(uchar *)((long)local_458[0] + 3))))) {
                        bVar21 = false;
                      }
                      if (local_458[0] != local_448) {
                        operator_delete(local_458[0],local_448[0] + 1);
                      }
                      if ((bVar21) &&
                         (uVar17 = (long)local_670.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_670.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start, uVar17 != 0)) {
                        uVar15 = 0;
                        uVar19 = 0;
                        do {
                          local_608.super_full_box.super_box.size_ = 0;
                          local_608.super_full_box.super_box.large_size_ = 0;
                          local_608.super_full_box.super_box.box_type_._M_dataplus._M_p =
                               (pointer)&local_608.super_full_box.super_box.box_type_.field_2;
                          local_608.super_full_box.super_box.box_type_._M_string_length = 0;
                          local_608.super_full_box.super_box.box_type_.field_2._M_local_buf[0] =
                               '\0';
                          local_608.super_full_box.super_box._100_4_ = 0;
                          local_608.super_full_box.magic_conf_ = 0;
                          local_608.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._0_3_ = 0;
                          local_608.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._3_5_ = 0;
                          local_608.super_full_box.super_box.is_large_ = false;
                          local_608.super_full_box.super_box.has_uuid_ = false;
                          local_608.super_full_box.super_box._98_1_ = 0;
                          local_608.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_608.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish._0_3_ = 0;
                          local_608.super_full_box.super_box.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish._3_5_ = 0;
                          local_608.super_full_box.super_box._vptr_box =
                               (_func_int **)&PTR_size_00121a88;
                          local_608.scheme_id_uri_._M_dataplus._M_p = (pointer)local_650;
                          local_608.scheme_id_uri_._M_string_length = 0;
                          local_608.scheme_id_uri_.field_2._M_local_buf[0] = '\0';
                          local_608.value_._M_dataplus._M_p = (pointer)local_648;
                          local_608.value_._M_string_length = 0;
                          local_608.value_.field_2._M_local_buf[0] = '\0';
                          (local_638->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          (local_638->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start = (pointer)0x0;
                          (local_638->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish = (pointer)0x0;
                          uVar12 = DASHEventMessageBoxv1::parse
                                             (&local_608,
                                              (char *)(local_670.
                                                                                                              
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar15
                                                  ),(uint)uVar17,local_658);
                          DASHEventMessageBoxv1::print(&local_608);
                          local_608.super_full_box.super_box._vptr_box =
                               (_func_int **)&PTR_size_00121a88;
                          if (local_608.message_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_608.message_data_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_608.message_data_.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_608.message_data_.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_608.value_._M_dataplus._M_p != local_648) {
                            operator_delete(local_608.value_._M_dataplus._M_p,
                                            CONCAT71(local_608.value_.field_2._M_allocated_capacity.
                                                     _1_7_,local_608.value_.field_2._M_local_buf[0])
                                            + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_608.scheme_id_uri_._M_dataplus._M_p != local_650) {
                            operator_delete(local_608.scheme_id_uri_._M_dataplus._M_p,
                                            CONCAT71(local_608.scheme_id_uri_.field_2.
                                                     _M_allocated_capacity._1_7_,
                                                     local_608.scheme_id_uri_.field_2._M_local_buf
                                                     [0]) + 1);
                          }
                          local_608.super_full_box.super_box._vptr_box =
                               (_func_int **)&PTR_size_00121ad0;
                          if (local_608.super_full_box.super_box.box_data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_608.super_full_box.super_box.box_data_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            CONCAT53(local_608.super_full_box.super_box.box_data_.
                                                                                                          
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._3_5_,local_608.super_full_box.super_box.
                                                         box_data_.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_3_) -
                                            (long)local_608.super_full_box.super_box.box_data_.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_608.super_full_box.super_box.box_type_._M_dataplus._M_p !=
                              &local_608.super_full_box.super_box.box_type_.field_2) {
                            operator_delete(local_608.super_full_box.super_box.box_type_._M_dataplus
                                            ._M_p,CONCAT71(local_608.super_full_box.super_box.
                                                           box_type_.field_2._M_allocated_capacity.
                                                           _1_7_,local_608.super_full_box.super_box.
                                                                 box_type_.field_2._M_local_buf[0])
                                                  + 1);
                          }
                          uVar19 = uVar19 + uVar12;
                          uVar15 = (ulong)uVar19;
                          uVar17 = (long)local_670.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_670.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                        } while (uVar15 < uVar17);
                      }
                    }
                  }
                  uVar19 = *(uint *)((long)&(local_c8.m_sentry.
                                             super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                            sample_duration_ + local_520);
                  if (local_670.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_670.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_670.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_670.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  local_640 = (ulong)(uVar6 + (int)local_640);
                  local_658 = local_658 + uVar19;
                  uVar17 = local_518 + 1;
                  piVar20 = local_630;
                } while (uVar17 < (ulong)((long)local_c8.m_sentry.
                                                super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_c8.m_sentry.
                                                super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following"
                       ,0x68);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
            std::ostream::put('\x10');
            std::ostream::flush();
          }
          pbVar18 = pbVar18 + 1;
          fmp4_stream::media_fragment::~media_fragment((media_fragment *)local_418);
        }
        psVar1 = &pbVar18->box_type_;
        iVar11 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar11 == 0) {
          uVar9 = *(undefined4 *)&pbVar18->field_0xc;
          uVar7 = pbVar18->large_size_;
          local_4b8[0] = pbVar18->size_;
          local_4b8[1] = uVar9;
          *(uint64_t *)(local_4b8 + 2) = uVar7;
          std::__cxx11::string::_M_assign(local_4c0);
          uVar8 = *(undefined8 *)(pbVar18->extended_type_ + 8);
          *(undefined8 *)local_4d8 = *(undefined8 *)pbVar18->extended_type_;
          *(undefined8 *)(local_4d8 + 8) = uVar8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_4e0,&pbVar18->box_data_);
          bVar21 = pbVar18->has_uuid_;
          (piVar20->super_ingest_stream).mfra_box_.is_large_ = pbVar18->is_large_;
          (piVar20->super_ingest_stream).mfra_box_.has_uuid_ = bVar21;
        }
        iVar11 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar11 == 0) {
          uVar9 = *(undefined4 *)&pbVar18->field_0xc;
          uVar7 = pbVar18->large_size_;
          local_4c8[0] = pbVar18->size_;
          local_4c8[1] = uVar9;
          *(uint64_t *)(local_4c8 + 2) = uVar7;
          std::__cxx11::string::_M_assign(local_4d0);
          uVar8 = *(undefined8 *)(pbVar18->extended_type_ + 8);
          *(undefined8 *)local_4e8 = *(undefined8 *)pbVar18->extended_type_;
          *(undefined8 *)(local_4e8 + 8) = uVar8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_4f0,&pbVar18->box_data_);
          bVar21 = pbVar18->has_uuid_;
          (piVar20->super_ingest_stream).sidx_box_.is_large_ = pbVar18->is_large_;
          (piVar20->super_ingest_stream).sidx_box_.has_uuid_ = bVar21;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|sidx|",6);
        }
        iVar11 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar11 == 0) {
          uVar9 = *(undefined4 *)&pbVar18->field_0xc;
          uVar7 = pbVar18->large_size_;
          local_4f8[0] = pbVar18->size_;
          local_4f8[1] = uVar9;
          *(uint64_t *)(local_4f8 + 2) = uVar7;
          std::__cxx11::string::_M_assign(local_500);
          uVar8 = *(undefined8 *)(pbVar18->extended_type_ + 8);
          *(undefined8 *)local_508 = *(undefined8 *)pbVar18->extended_type_;
          *(undefined8 *)(local_508 + 8) = uVar8;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_510,&pbVar18->box_data_);
          bVar21 = pbVar18->has_uuid_;
          (piVar20->super_ingest_stream).meta_box_.is_large_ = pbVar18->is_large_;
          (piVar20->super_ingest_stream).meta_box_.has_uuid_ = bVar21;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|meta|",6);
        }
        pbVar18 = pbVar18 + 1;
      } while (pbVar18 !=
               local_628.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_628);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***  finished reading fmp4 fragments  ***",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return 0;
}

Assistant:

int event_track::ingest_event_stream::print_samples_from_file(std::istream &infile, bool init_only)
{
	try
	{
		if (infile)
		{
			std::vector<box> ingest_boxes;

			while (infile.good()) // read box by box in a vector
			{
				box b = {};

				if (b.read(infile))
					ingest_boxes.push_back(b);
				else  // break when we have boxes of size zero
					break;

				if (b.box_type_.compare("mfra") == 0)
					break;
			}

			// organize the boxes in init fragments and media fragments 
			for (auto it = ingest_boxes.begin(); it != ingest_boxes.end(); ++it)
			{
				if (it->box_type_.compare("ftyp") == 0)
				{
					//cout << "|ftyp|";
					init_fragment_.ftyp_box_ = *it;
				}
				if (it->box_type_.compare("moov") == 0)
				{
					//cout << "|moov|";
					init_fragment_.moov_box_ = *it;

					if (init_only)
						return 0;
				}

				if (it->box_type_.compare("moof") == 0) // in case of moof box we push both the moof and following mdat
				{
					media_fragment m = {};
					m.moof_box_ = *it;
					m.parse_moof();
					bool mdat_found = false;
					std::cout << "==  found movie fragment with base media decode time: " << m.tfdt_.base_media_decode_time_ << std::endl;
					it++;

					// only support default base is moof and mdat immediately following (CMAF)
					if (m.tfhd_.default_base_is_moof_ && (m.trun_.data_offset_ - 8) == m.moof_box_.size_) {

						if (it->box_type_.compare("mdat") == 0)
						{
							m.mdat_box_ = *it;
							uint64_t pres_time = m.tfdt_.base_media_decode_time_;
							uint32_t data_offset = 0;

							if (m.trun_.sample_duration_present_ && m.trun_.sample_size_present_)
							{
								for (int i = 0; i < m.trun_.m_sentry.size(); i++)
								{
									uint32_t ss = m.trun_.m_sentry[i].sample_size_;
									std::vector<uint8_t> sample_data(ss);
									std::cout << "== found sample, presentation time = " << pres_time <<
										" duration = " \
										<< m.trun_.m_sentry[i].sample_duration_ << " sample size = " << m.trun_.m_sentry[i].sample_size_ << " == " << std::endl;
									for (unsigned int j = 0; j < ss; j++)
										sample_data[j] = m.mdat_box_.box_data_[8 + data_offset + j];

									//parse_event_sample(sample_data,uint64_t presentation_time, )
									unsigned int bts = 0;
									if (ss > 8)
									{
										if (compare_4cc((char *) &sample_data[4], "emib")) {
											while (bts < sample_data.size()) {
												EventMessageInstanceBox im_box;
												bts += im_box.parse((char *)sample_data.data() + bts, (unsigned int)sample_data.size(),pres_time);
												im_box.print();
											}
										}
										else if (compare_4cc((char *)&sample_data[4], "emsg"))
										{
											while (bts < sample_data.size()) 
											{
												DASHEventMessageBoxv1 e;
												bts += e.parse((char *)sample_data.data() + bts, (unsigned int) sample_data.size(),pres_time);
												e.print();
											}
										}
									}
									else
									{
										std::cout << "empty sample (embe/emeb): " << std::endl;
									}

									data_offset += ss;
									pres_time += m.trun_.m_sentry[i].sample_duration_;
								}
							}
						}
					}
					else
					{
						std::cout << "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following" << std::endl;
					}
				}
				if (it->box_type_.compare("mfra") == 0)
				{
					this->mfra_box_ = *it;
				}
				if (it->box_type_.compare("sidx") == 0)
				{
					this->sidx_box_ = *it;
					std::cout << "|sidx|";
				}
				if (it->box_type_.compare("meta") == 0)
				{
					this->meta_box_ = *it;
					std::cout << "|meta|";
				}
			}
		}
		std::cout << std::endl;
		std::cout << "***  finished reading fmp4 fragments  ***" << std::endl;

		return 0;
	}
	catch (std::exception e)
	{
		std::cout << e.what() << std::endl;
		return 0;
	}
}